

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional2::PipelineStatisticsQueryTestFunctional2
          (PipelineStatisticsQueryTestFunctional2 *this,Context *context)

{
  Context *context_local;
  PipelineStatisticsQueryTestFunctional2 *this_local;
  
  PipelineStatisticsQueryTestFunctionalBase::PipelineStatisticsQueryTestFunctionalBase
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,context,
             "functional_non_rendering_commands_do_not_affect_queries",
             "Verifies that non-rendering commands do not affect query values.");
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PipelineStatisticsQueryTestFunctional2_0324c400;
  this->m_bo_id = 0;
  this->m_fbo_draw_id = 0;
  this->m_fbo_read_id = 0;
  this->m_to_draw_fbo_id = 0;
  this->m_to_read_fbo_id = 0;
  this->m_to_height = 0x10;
  this->m_to_width = 0x10;
  return;
}

Assistant:

PipelineStatisticsQueryTestFunctional2::PipelineStatisticsQueryTestFunctional2(deqp::Context& context)
	: PipelineStatisticsQueryTestFunctionalBase(context, "functional_non_rendering_commands_do_not_affect_queries",
												"Verifies that non-rendering commands do not affect query"
												" values.")
	, m_bo_id(0)
	, m_fbo_draw_id(0)
	, m_fbo_read_id(0)
	, m_to_draw_fbo_id(0)
	, m_to_read_fbo_id(0)
	, m_to_height(16)
	, m_to_width(16)
{
	/* Left blank intentionally */
}